

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsGramNode * __thiscall CTcPrsGramNodeCat::consolidate_or(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsGramNodeCat *sub;
  undefined4 extraout_var_00;
  CTcPrsGramNodeOr *in_RDI;
  CTcPrsGramNodeCat *new_cat;
  int or_cnt;
  CTcPrsGramNode *nxt;
  CTcPrsGramNode *cur;
  CTcPrsGramNodeOr *new_or;
  CTcPrsGramNode *old_head;
  CTcPrsMem *in_stack_ffffffffffffff98;
  CTcPrsGramNodeCat *in_stack_ffffffffffffffa0;
  int local_34;
  CTcPrsGramNode *local_28;
  CTcPrsGramNodeOr *local_8;
  
  local_28 = (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_;
  (in_RDI->super_CTcPrsGramNodeWithChildren).sub_tail_ = (CTcPrsGramNode *)0x0;
  (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_ = (CTcPrsGramNode *)0x0;
  while (local_28 != (CTcPrsGramNode *)0x0) {
    pCVar1 = local_28->next_;
    iVar2 = (*(local_28->super_CTcTokenSource)._vptr_CTcTokenSource[3])();
    CTcPrsGramNodeWithChildren::add_sub_item
              (&in_RDI->super_CTcPrsGramNodeWithChildren,
               (CTcPrsGramNode *)CONCAT44(extraout_var,iVar2));
    local_28 = pCVar1;
  }
  local_34 = 0;
  for (local_28 = (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_;
      local_28 != (CTcPrsGramNode *)0x0; local_28 = local_28->next_) {
    iVar2 = (*(local_28->super_CTcTokenSource)._vptr_CTcTokenSource[5])();
    if (iVar2 != 0) {
      local_34 = local_34 + 1;
    }
  }
  local_8 = in_RDI;
  if (local_34 != 0) {
    local_8 = (CTcPrsGramNodeOr *)
              operator_new((size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    memset(local_8,0,0x88);
    CTcPrsGramNodeOr::CTcPrsGramNodeOr(local_8);
    for (local_28 = (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_;
        local_28 != (CTcPrsGramNode *)0x0; local_28 = local_28->next_) {
      (*(local_28->super_CTcTokenSource)._vptr_CTcTokenSource[8])();
    }
    do {
      sub = (CTcPrsGramNodeCat *)
            operator_new((size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      memset(sub,0,0x58);
      CTcPrsGramNodeCat(in_stack_ffffffffffffffa0);
      for (local_28 = (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_;
          local_28 != (CTcPrsGramNode *)0x0; local_28 = local_28->next_) {
        in_stack_ffffffffffffffa0 = sub;
        iVar2 = (*(local_28->super_CTcTokenSource)._vptr_CTcTokenSource[10])();
        CTcPrsGramNodeWithChildren::add_sub_item
                  (&in_stack_ffffffffffffffa0->super_CTcPrsGramNodeWithChildren,
                   (CTcPrsGramNode *)CONCAT44(extraout_var_00,iVar2));
      }
      CTcPrsGramNodeWithChildren::add_sub_item
                (&local_8->super_CTcPrsGramNodeWithChildren,(CTcPrsGramNode *)sub);
      local_28 = (in_RDI->super_CTcPrsGramNodeWithChildren).sub_head_;
      while ((local_28 != (CTcPrsGramNode *)0x0 &&
             (iVar2 = (*(local_28->super_CTcTokenSource)._vptr_CTcTokenSource[9])(), iVar2 != 0))) {
        local_28 = local_28->next_;
      }
    } while (local_28 != (CTcPrsGramNode *)0x0);
  }
  return (CTcPrsGramNode *)local_8;
}

Assistant:

CTcPrsGramNode *CTcPrsGramNodeCat::consolidate_or()
{
    CTcPrsGramNode *old_head;
    CTcPrsGramNodeOr *new_or;
    CTcPrsGramNode *cur;
    CTcPrsGramNode *nxt;
    int or_cnt;

    /* 
     *   Consolidate OR's in all subtrees.  Before we do, stash away our
     *   entire subtree, since we'll rebuild the tree from the updated
     *   versions.  
     */
    old_head = sub_head_;
    sub_head_ = sub_tail_ = 0;

    /* run through our old list and build the new, consolidated list */
    for (cur = old_head ; cur != 0 ; cur = nxt)
    {
        /* remember the next item in the old list */
        nxt = cur->next_;

        /* consolidate the subtree and add it to our new list */
        add_sub_item(cur->consolidate_or());
    }

    /* 
     *   Count of OR nodes - if we don't have any, we don't have to make any
     *   changes.  Since we've already consolidated all OR's out of
     *   sub-nodes into a single node at the top of each subtree, we don't
     *   have to worry about OR's below our immediate children.  
     */
    for (or_cnt = 0, cur = sub_head_ ; cur != 0 ; cur = cur->next_)
    {
        /* if it's an OR node, count it */
        if (cur->is_or())
            ++or_cnt;
    }

    /* if we have no OR nodes, we need no changes */
    if (or_cnt == 0)
        return this;

    /* create a new OR node to contain the list of expansions */
    new_or = new (G_prsmem) CTcPrsGramNodeOr();

    /* set up each OR node with the next alternative */
    for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
        cur->init_expansion();

    /*
     *   Iterate through all of the possibilities.  For each iteration,
     *   we'll build the currently selected alternative, then we'll advance
     *   by one alternative.  We'll keep doing this until we've advanced
     *   through all of the alternatives.  
     */
    for (;;)
    {
        CTcPrsGramNodeCat *new_cat;

        /* create a new CAT node for the current selected alternative */
        new_cat = new (G_prsmem) CTcPrsGramNodeCat();

        /* clone and add each current alternative to the new CAT node */
        for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
            new_cat->add_sub_item(cur->clone_expansion());

        /* 
         *   we've finished this entire expansion, so add it to the new main
         *   OR we're building 
         */
        new_or->add_sub_item(new_cat);

        /*
         *   Go through the list of subitems and advance to the next OR
         *   state.  Stop when we reach the first item that advances without
         *   a 'carry'.  If we're still carrying when we reach the last
         *   item, we know we've wrapped around back to the first
         *   alternative and hence are done.  
         */
        for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
        {
            /* advance this one; if it doesn't carry, we're done */
            if (!cur->advance_expansion())
                break;
        }

        /* 
         *   if we carried past the last item, we've wrapped around back to
         *   the first alternative, so we're done 
         */
        if (cur == 0)
            break;
    }
    
    /* return the new main OR we built */
    return new_or;
}